

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

Result __thiscall
spectest::CommandRunner::OnAssertUninstantiableCommand
          (CommandRunner *this,AssertUninstantiableCommand *command)

{
  string_view module_filename;
  Ref *pRVar1;
  Enum EVar2;
  bool bVar3;
  Ptr trap;
  Ptr module;
  Ptr instance;
  RefVec imports;
  Errors errors;
  Ptr local_b8;
  Ptr local_98;
  Ptr local_78;
  RefVec local_58;
  Errors local_38;
  
  local_38.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  module_filename.data_ = (command->filename)._M_dataplus._M_p;
  module_filename.size_ = (command->filename)._M_string_length;
  ReadModule(&local_98,this,module_filename,&local_38);
  if (local_98.obj_ == (Module *)0x0) {
    PrintError(this,(command->super_CommandMixin<(wabt::CommandType)6>).super_Command.line,
               "unable to compile uninstantiable module: \"%s\"",
               (command->filename)._M_dataplus._M_p);
    EVar2 = Error;
  }
  else {
    local_58.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    PopulateImports(this,&local_98,&local_58);
    local_b8.root_index_ = 0;
    local_b8.obj_ = (Trap *)0x0;
    local_b8.store_ = (Store *)0x0;
    if (local_98.store_ == (Store *)0x0) {
      pRVar1 = (Ref *)&wabt::interp::Ref::Null;
    }
    else {
      pRVar1 = wabt::interp::FreeList<wabt::interp::Ref>::Get
                         (&(local_98.store_)->roots_,local_98.root_index_);
    }
    wabt::interp::Instance::Instantiate
              (&local_78,&this->store_,(Ref)pRVar1->index,&local_58,&local_b8);
    bVar3 = local_b8.obj_ == (Trap *)0x0;
    if (bVar3) {
      PrintError(this,(command->super_CommandMixin<(wabt::CommandType)6>).super_Command.line,
                 "expected module to be uninstantiable: \"%s\"",(command->filename)._M_dataplus._M_p
                );
    }
    EVar2 = (Enum)bVar3;
    if (local_78.obj_ != (Instance *)0x0) {
      wabt::interp::Store::DeleteRoot(local_78.store_,local_78.root_index_);
      local_78.obj_ = (Instance *)0x0;
      local_78.store_ = (Store *)0x0;
      local_78.root_index_ = 0;
    }
    if (local_b8.obj_ != (Trap *)0x0) {
      wabt::interp::Store::DeleteRoot(local_b8.store_,local_b8.root_index_);
      local_b8.obj_ = (Trap *)0x0;
      local_b8.store_ = (Store *)0x0;
      local_b8.root_index_ = 0;
    }
    if (local_58.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_98.obj_ != (Module *)0x0) {
    wabt::interp::Store::DeleteRoot(local_98.store_,local_98.root_index_);
    local_98.obj_ = (Module *)0x0;
    local_98.store_ = (Store *)0x0;
    local_98.root_index_ = 0;
  }
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_38);
  return (Result)EVar2;
}

Assistant:

wabt::Result CommandRunner::OnAssertUninstantiableCommand(
    const AssertUninstantiableCommand* command) {
  Errors errors;
  auto module = ReadModule(command->filename, &errors);

  if (!module) {
    PrintError(command->line, "unable to compile uninstantiable module: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  RefVec imports;
  PopulateImports(module, &imports);

  Trap::Ptr trap;
  auto instance = Instance::Instantiate(store_, module.ref(), imports, &trap);
  if (!trap) {
    PrintError(command->line, "expected module to be uninstantiable: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  // TODO: print error when assertion passes.
#if 0
  PrintError(command->line, "assert_uninstantiable passed: %s",
             trap->message().c_str());
#endif
  return wabt::Result::Ok;
}